

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void secure_random_fill(void *bytes,uint length)

{
  uint uVar1;
  
  if (secure_random_data_0 == '\0') {
    dbg_msg("secure","called secure_random_fill before secure_random_init");
    _DAT_00000000 = 0;
  }
  uVar1 = io_read(secure_random_data_1,bytes,length);
  if (uVar1 != length) {
    dbg_msg("secure","io_read returned with a short read");
    _DAT_00000000 = 0;
  }
  return;
}

Assistant:

void secure_random_fill(void *bytes, unsigned length)
{
	if(!secure_random_data.initialized)
	{
		dbg_msg("secure", "called secure_random_fill before secure_random_init");
		dbg_break();
	}
#if defined(CONF_FAMILY_WINDOWS)
	if(!CryptGenRandom(secure_random_data.provider, length, bytes))
	{
		dbg_msg("secure", "CryptGenRandom failed, last_error=%lu", GetLastError());
		dbg_break();
	}
#else
	if(length != io_read(secure_random_data.urandom, bytes, length))
	{
		dbg_msg("secure", "io_read returned with a short read");
		dbg_break();
	}
#endif
}